

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

int __thiscall ncnn::Log::forward_inplace(Log *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  uVar1 = bottom_top_blob->c;
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  if (this->base == -1.0) {
    if (0 < (int)uVar1) {
      pvVar6 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      sVar3 = bottom_top_blob->elemsize;
      uVar7 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar5 = 0;
          do {
            fVar8 = logf(this->scale * *(float *)((long)pvVar6 + uVar5 * 4) + this->shift);
            *(float *)((long)pvVar6 + uVar5 * 4) = fVar8;
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        uVar7 = uVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
      } while (uVar7 != uVar1);
    }
  }
  else if (0 < (int)uVar1) {
    fVar8 = logf(this->base);
    pvVar6 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    uVar7 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          fVar9 = logf(this->scale * *(float *)((long)pvVar6 + uVar5 * 4) + this->shift);
          *(float *)((long)pvVar6 + uVar5 * 4) = fVar9 * (1.0 / fVar8);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      uVar7 = uVar7 + 1;
      pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
    } while (uVar7 != uVar1);
  }
  return 0;
}

Assistant:

int Log::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = static_cast<float>(log(shift + ptr[i] * scale));
            }
        }
    }
    else
    {
        float log_base_inv = static_cast<float>(1.f / log(base));

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = static_cast<float>(log(shift + ptr[i] * scale) * log_base_inv);
            }
        }
    }

    return 0;
}